

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00m1.cpp
# Opt level: O3

int main(void)

{
  value_type vVar1;
  int iVar2;
  istream *this;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  value_type vVar6;
  iterator __begin1;
  value_type vVar7;
  int M;
  int N;
  Comp c;
  int x;
  vector<int,_std::allocator<int>_> time;
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  wait;
  int local_8c;
  int local_88;
  Comp local_81;
  pair<int,_int> local_80;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_78;
  value_type local_58;
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  local_50;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105160) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_88);
  std::istream::operator>>(this,&local_8c);
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  ::priority_queue(&local_50,&local_81,&local_78);
  if ((value_type)
      local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (value_type)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (0 < local_88) {
    iVar4 = 0;
    do {
      if (iVar4 == local_8c) goto LAB_00101459;
      std::istream::operator>>((istream *)&std::cin,&local_80.first);
      local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = local_80.first;
      local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_80.first;
      std::
      priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
      ::push(&local_50,(value_type *)&local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0\n",2);
      iVar4 = iVar4 + 1;
    } while (iVar4 < local_88);
  }
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_8c != local_88) {
    iVar5 = 1;
    vVar7.first = 0;
    vVar7.second = 0;
    vVar6.first = 0;
    vVar6.second = 0;
    iVar4 = local_8c;
    iVar2 = local_88;
    do {
      if ((local_50.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->first <= iVar5) {
        local_80 = *local_50.c.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        std::
        priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
        ::pop(&local_50);
        if (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    ((vector<int,std::allocator<int>> *)&local_78,
                     (iterator)
                     local_78.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_80.first);
        }
        else {
          (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->first = local_80.first;
          local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_78.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
        }
        local_58.first = local_80.first + local_80.second;
        local_58.second = local_80.second;
        std::
        priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
        ::push(&local_50,&local_58);
        vVar6 = (value_type)
                local_78.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        vVar7 = (value_type)
                local_78.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
        iVar4 = local_8c;
        iVar2 = local_88;
      }
      iVar5 = iVar5 + 1;
      vVar1 = vVar7;
    } while ((ulong)((long)vVar6 - (long)vVar7 >> 2) < (ulong)((long)iVar4 - (long)iVar2));
    for (; vVar7 != vVar6; vVar7 = (value_type)((long)vVar7 + 4)) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)vVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      vVar1 = (value_type)
              local_78.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    }
    if (vVar1 != (value_type)0x0) {
      operator_delete((void *)vVar1,
                      (long)local_78.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)vVar1);
    }
  }
LAB_00101459:
  if (local_50.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.c.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.c.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.c.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int N, M;
    cin >> N >> M;
    Comp c;
    priority_queue<pii, vector<pii>, Comp> wait(c);
    for (int i = 0; i < N; ++i) {
        if (i == M) return 0;
        int x;
        cin >> x;
        wait.push(make_pair(x, x));
        cout << "0\n";
    }
    vector<int> time;
    int i = 1;
    while (time.size() < (size_t)M-N) {
        if (wait.top().first <= i) {
            auto top = wait.top();
            wait.pop();
            time.emplace_back(top.first);
            wait.push(make_pair(top.first + top.second,
                                top.second));
        }
        ++i;
    }

    for (auto &e : time) {
        cout << e << "\n";
    }
}